

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O0

void Ndr_DataPushRange(Ndr_Data_t *p,int RangeLeft,int RangeRight,int fSignedness)

{
  int fSignedness_local;
  int RangeRight_local;
  int RangeLeft_local;
  Ndr_Data_t *p_local;
  
  if (fSignedness == 0) {
    if ((RangeLeft != 0) || (RangeRight != 0)) {
      if (RangeLeft == RangeRight) {
        Ndr_DataPush(p,8,RangeLeft);
      }
      else {
        Ndr_DataPush(p,8,RangeLeft);
        Ndr_DataPush(p,8,RangeRight);
      }
    }
  }
  else {
    Ndr_DataPush(p,8,RangeLeft);
    Ndr_DataPush(p,8,RangeRight);
    Ndr_DataPush(p,8,fSignedness);
  }
  return;
}

Assistant:

static inline void Ndr_DataPushRange( Ndr_Data_t * p, int RangeLeft, int RangeRight, int fSignedness )
{ 
    if ( fSignedness )
    {
        Ndr_DataPush( p, NDR_RANGE, RangeLeft );
        Ndr_DataPush( p, NDR_RANGE, RangeRight );
        Ndr_DataPush( p, NDR_RANGE, fSignedness );
        return;
    }
    if ( !RangeLeft && !RangeRight )
        return;
    if ( RangeLeft == RangeRight )
        Ndr_DataPush( p, NDR_RANGE, RangeLeft );
    else
    {
        Ndr_DataPush( p, NDR_RANGE, RangeLeft );
        Ndr_DataPush( p, NDR_RANGE, RangeRight );
    }
}